

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O2

void __thiscall
wasm::ParallelFuncCastEmulation::~ParallelFuncCastEmulation(ParallelFuncCastEmulation *this)

{
  WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
  ::~WalkerPass(&this->
                 super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
               );
  operator_delete(this,0x118);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }